

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::AddRecursiveImportError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int from_here)

{
  pointer pbVar1;
  ulong uVar2;
  ulong uVar3;
  string error_message;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"File recursively imports itself: ","");
  uVar3 = (ulong)from_here;
  pbVar1 = (this->tables_->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->tables_->pending_files_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    uVar2 = uVar3 << 5 | 8;
    do {
      std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)((long)pbVar1 + (uVar2 - 8)));
      std::__cxx11::string::append((char *)&local_50);
      uVar3 = uVar3 + 1;
      pbVar1 = (this->tables_->pending_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = uVar2 + 0x20;
    } while (uVar3 < (ulong)((long)(this->tables_->pending_files_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5));
  }
  std::__cxx11::string::_M_append
            ((char *)&local_50,(ulong)(((proto->name_).ptr_)->_M_dataplus)._M_p);
  AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::AddRecursiveImportError(
    const FileDescriptorProto& proto, int from_here) {
  string error_message("File recursively imports itself: ");
  for (int i = from_here; i < tables_->pending_files_.size(); i++) {
    error_message.append(tables_->pending_files_[i]);
    error_message.append(" -> ");
  }
  error_message.append(proto.name());

  AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
           error_message);
}